

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

int __thiscall Assimp::IOSystem2Unzip::open(IOSystem2Unzip *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *pcVar2;
  
  if ((__oflag & 3U) == 1) {
    pcVar2 = "rb";
  }
  else if ((__oflag & 4U) == 0) {
    pcVar2 = (char *)0x0;
    if ((__oflag & 8U) != 0) {
      pcVar2 = "wb";
    }
  }
  else {
    pcVar2 = "r+b";
  }
  iVar1 = (**(code **)(*(long *)this + 0x20))(this,__file,pcVar2);
  return iVar1;
}

Assistant:

voidpf IOSystem2Unzip::open(voidpf opaque, const char* filename, int mode) {
        IOSystem* io_system = reinterpret_cast<IOSystem*>(opaque);

        const char* mode_fopen = nullptr;
        if ((mode & ZLIB_FILEFUNC_MODE_READWRITEFILTER) == ZLIB_FILEFUNC_MODE_READ) {
            mode_fopen = "rb";
        }
        else {
            if (mode & ZLIB_FILEFUNC_MODE_EXISTING) {
                mode_fopen = "r+b";
            }
            else {
                if (mode & ZLIB_FILEFUNC_MODE_CREATE) {
                    mode_fopen = "wb";
                }
            }
        }

        return (voidpf)io_system->Open(filename, mode_fopen);
    }